

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O0

int loader_execution_path(char *tag,char *path)

{
  int iVar1;
  plugin ppVar2;
  char *in_RSI;
  loader_impl in_RDI;
  plugin p;
  char *in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = loader_initialize();
  if (iVar1 == 1) {
    iVar1 = 1;
  }
  else {
    ppVar2 = loader_get_impl_plugin(in_stack_ffffffffffffffd8);
    if (ppVar2 == (plugin)0x0) {
      log_write_impl_va("metacall",0x13f,"loader_execution_path",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader.c"
                        ,3,"Tried to define an execution path from non existent loader (%s): %s",
                        in_RDI,in_RSI);
      iVar1 = 1;
    }
    else {
      plugin_impl(ppVar2);
      iVar1 = loader_impl_execution_path
                        ((plugin)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         in_RDI,in_RSI);
    }
  }
  return iVar1;
}

Assistant:

int loader_execution_path(const loader_tag tag, const loader_path path)
{
	if (loader_initialize() == 1)
	{
		return 1;
	}

	plugin p = loader_get_impl_plugin(tag);

	if (p == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Tried to define an execution path from non existent loader (%s): %s", tag, path);
		return 1;
	}

	/* TODO: Disable logs here until log is completely thread safe and async signal safe */
	/* log_write("metacall", LOG_LEVEL_DEBUG, "Define execution path (%s): %s", tag, path); */

	return loader_impl_execution_path(p, plugin_impl_type(p, loader_impl), path);
}